

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O1

int separatorMoveHelper(QList<QLayoutStruct> *list,int index,int delta,int sep)

{
  int iVar1;
  QLayoutStruct *pQVar2;
  pointer pQVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int *piVar8;
  ulong uVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  long lVar15;
  bool bVar16;
  int local_48;
  
  lVar11 = (list->d).size;
  if (lVar11 == 0) {
    local_48 = -1;
  }
  else {
    pQVar2 = (list->d).ptr;
    local_48 = -1;
    lVar15 = 0;
    do {
      bVar16 = (&pQVar2->empty)[lVar15];
      if (bVar16 == false) {
        local_48 = *(int *)((long)&pQVar2->pos + lVar15);
      }
    } while ((bVar16 == true) &&
            (bVar16 = lVar11 * 0x20 + -0x20 != lVar15, lVar15 = lVar15 + 0x20, bVar16));
  }
  if (local_48 == -1) {
    iVar10 = 0;
  }
  else {
    iVar10 = 0;
    if (delta < 1) {
      if (delta < 0) {
        lVar15 = (long)(index + 1);
        iVar4 = 0;
        iVar10 = 0;
        if (lVar15 < lVar11) {
          piVar8 = &(list->d).ptr[lVar15].size;
          iVar10 = 0;
          lVar12 = lVar15;
          do {
            lVar13 = 0;
            if (*(bool *)((long)piVar8 + -7) == false) {
              if (piVar8[-5] == 0x7ffff) {
                iVar10 = 0x7ffff;
                lVar13 = 0xe;
              }
              else {
                iVar10 = (piVar8[-5] + iVar10) - *piVar8;
                lVar13 = 0;
              }
            }
            if (lVar13 != 0) break;
            lVar12 = lVar12 + 1;
            piVar8 = piVar8 + 8;
          } while (lVar12 < lVar11);
        }
        iVar5 = -iVar10;
        if (SBORROW4(iVar10,-delta) == iVar10 + delta < 0) {
          iVar5 = delta;
        }
        if (-1 < index && iVar5 < 0) {
          uVar9 = (ulong)(uint)index << 5 | 0x1c;
          iVar4 = 0;
          uVar14 = (ulong)(uint)index;
          do {
            pQVar3 = QList<QLayoutStruct>::data(list);
            iVar10 = 0;
            if (*(char *)((long)pQVar3 + (uVar9 - 7)) == '\0') {
              iVar7 = *(int *)((long)pQVar3 + (uVar9 - 0x10));
              iVar10 = *(int *)((long)&pQVar3->stretch + uVar9);
              iVar6 = iVar5 + iVar4 + iVar10;
              if (iVar6 <= iVar7) {
                iVar6 = iVar7;
              }
              *(int *)((long)&pQVar3->stretch + uVar9) = iVar6;
              iVar10 = iVar10 - iVar6;
            }
            iVar4 = iVar10 + iVar4;
            if (SBORROW4(iVar4,-iVar5) == iVar4 + iVar5 < 0) break;
            uVar9 = uVar9 - 0x20;
            bVar16 = 0 < (long)uVar14;
            uVar14 = uVar14 - 1;
          } while (bVar16);
        }
        iVar10 = -iVar4;
        if (0 < iVar4) {
          lVar11 = lVar15 + -1;
          uVar14 = lVar15 << 5 | 0x1c;
          iVar5 = 0;
          do {
            lVar11 = lVar11 + 1;
            if ((list->d).size <= lVar11) break;
            pQVar3 = QList<QLayoutStruct>::data(list);
            iVar7 = 0;
            if (*(char *)((long)pQVar3 + (uVar14 - 7)) == '\0') {
              iVar6 = *(int *)((long)pQVar3 + (uVar14 - 0x14));
              iVar1 = *(int *)((long)&pQVar3->stretch + uVar14);
              iVar7 = (iVar4 - iVar5) + iVar1;
              if (iVar6 <= iVar7) {
                iVar7 = iVar6;
              }
              *(int *)((long)&pQVar3->stretch + uVar14) = iVar7;
              iVar7 = iVar7 - iVar1;
            }
            uVar14 = uVar14 + 0x20;
            iVar5 = iVar5 + iVar7;
          } while (iVar5 < iVar4);
        }
      }
    }
    else {
      iVar4 = 0;
      if (-1 < index) {
        pQVar2 = (list->d).ptr;
        lVar11 = 0;
        iVar4 = 0;
        do {
          iVar5 = 7;
          if ((&pQVar2->empty)[lVar11] == false) {
            iVar5 = *(int *)((long)&pQVar2->maximumSize + lVar11);
            if (iVar5 == 0x7ffff) {
              iVar4 = 0x7ffff;
              iVar5 = 5;
            }
            else {
              iVar4 = (iVar5 + iVar4) - *(int *)((long)&pQVar2->size + lVar11);
              iVar5 = 0;
            }
          }
        } while (((iVar5 == 7) || (iVar5 == 0)) &&
                (lVar11 = lVar11 + 0x20, (ulong)(uint)index * 0x20 + 0x20 != lVar11));
      }
      if (iVar4 < delta) {
        delta = iVar4;
      }
      if (0 < iVar4) {
        lVar11 = (long)index;
        lVar15 = lVar11 * 0x20 + 0x3c;
        iVar10 = 0;
        do {
          lVar11 = lVar11 + 1;
          if ((list->d).size <= lVar11) break;
          pQVar3 = QList<QLayoutStruct>::data(list);
          iVar4 = 0;
          if (*(char *)((long)pQVar3 + lVar15 + -7) == '\0') {
            iVar5 = *(int *)((long)pQVar3 + lVar15 + -0x10);
            iVar4 = *(int *)((long)&pQVar3->stretch + lVar15);
            iVar7 = (iVar10 - delta) + iVar4;
            if (iVar7 <= iVar5) {
              iVar7 = iVar5;
            }
            *(int *)((long)&pQVar3->stretch + lVar15) = iVar7;
            iVar4 = iVar4 - iVar7;
          }
          lVar15 = lVar15 + 0x20;
          iVar10 = iVar10 + iVar4;
        } while (iVar10 < delta);
      }
      if (-1 < index && 0 < iVar10) {
        uVar9 = (ulong)(uint)index << 5 | 0x1c;
        iVar4 = 0;
        uVar14 = (ulong)(uint)index;
        do {
          pQVar3 = QList<QLayoutStruct>::data(list);
          iVar5 = 0;
          if (*(char *)((long)pQVar3 + (uVar9 - 7)) == '\0') {
            iVar7 = *(int *)((long)pQVar3 + (uVar9 - 0x14));
            iVar6 = *(int *)((long)&pQVar3->stretch + uVar9);
            iVar5 = (iVar10 - iVar4) + iVar6;
            if (iVar7 <= iVar5) {
              iVar5 = iVar7;
            }
            *(int *)((long)&pQVar3->stretch + uVar9) = iVar5;
            iVar5 = iVar5 - iVar6;
          }
          iVar4 = iVar4 + iVar5;
          if (iVar10 <= iVar4) break;
          uVar9 = uVar9 - 0x20;
          bVar16 = 0 < (long)uVar14;
          uVar14 = uVar14 - 1;
        } while (bVar16);
      }
    }
    if ((list->d).size != 0) {
      bVar16 = true;
      lVar11 = 0x1c;
      uVar14 = 0;
      do {
        pQVar3 = QList<QLayoutStruct>::data(list);
        iVar4 = sep;
        if (bVar16) {
          iVar4 = 0;
        }
        *(int *)((long)pQVar3 + lVar11 + -4) = iVar4 + local_48;
        if (*(char *)((long)pQVar3 + lVar11 + -7) == '\0') {
          local_48 = iVar4 + local_48 + *(int *)((long)&pQVar3->stretch + lVar11);
          bVar16 = false;
        }
        uVar14 = uVar14 + 1;
        lVar11 = lVar11 + 0x20;
      } while (uVar14 < (ulong)(list->d).size);
    }
  }
  return iVar10;
}

Assistant:

static int separatorMoveHelper(QList<QLayoutStruct> &list, int index, int delta, int sep)
{
    // adjust sizes
    int pos = -1;
    for (int i = 0; i < list.size(); ++i) {
        const QLayoutStruct &ls = list.at(i);
        if (!ls.empty) {
            pos = ls.pos;
            break;
        }
    }
    if (pos == -1)
        return 0;

    if (delta > 0) {
        int growlimit = 0;
        for (int i = 0; i<=index; ++i) {
            const QLayoutStruct &ls = list.at(i);
            if (ls.empty)
                continue;
            if (ls.maximumSize == QLAYOUTSIZE_MAX) {
                growlimit = QLAYOUTSIZE_MAX;
                break;
            }
            growlimit += ls.maximumSize - ls.size;
        }
        if (delta > growlimit)
            delta = growlimit;

        int d = 0;
        for (int i = index + 1; d < delta && i < list.size(); ++i)
            d += shrink(list[i], delta - d);
        delta = d;
        d = 0;
        for (int i = index; d < delta && i >= 0; --i)
            d += grow(list[i], delta - d);
    } else if (delta < 0) {
        int growlimit = 0;
        for (int i = index + 1; i < list.size(); ++i) {
            const QLayoutStruct &ls = list.at(i);
            if (ls.empty)
                continue;
            if (ls.maximumSize == QLAYOUTSIZE_MAX) {
                growlimit = QLAYOUTSIZE_MAX;
                break;
            }
            growlimit += ls.maximumSize - ls.size;
        }
        if (-delta > growlimit)
            delta = -growlimit;

        int d = 0;
        for (int i = index; d < -delta && i >= 0; --i)
            d += shrink(list[i], -delta - d);
        delta = -d;
        d = 0;
        for (int i = index + 1; d < -delta && i < list.size(); ++i)
            d += grow(list[i], -delta - d);
    }

    // adjust positions
    bool first = true;
    for (int i = 0; i < list.size(); ++i) {
        QLayoutStruct &ls = list[i];
        if (ls.empty) {
            ls.pos = pos + (first ? 0 : sep);
            continue;
        }
        if (!first)
            pos += sep;
        ls.pos = pos;
        pos += ls.size;
        first = false;
    }

    return delta;
}